

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  Char CVar1;
  undefined4 *in_RSI;
  Reader *in_RDI;
  bool ok;
  Char c;
  undefined6 in_stack_ffffffffffffffe8;
  byte bVar2;
  
  skipSpaces(in_RDI);
  *(Location *)(in_RSI + 2) = in_RDI->current_;
  CVar1 = getNextChar(in_RDI);
  bVar2 = 1;
  switch((Reader *)(ulong)(uint)(int)CVar1) {
  case (Reader *)0x0:
    *in_RSI = 0;
    break;
  default:
    bVar2 = 0;
    break;
  case (Reader *)0x22:
    *in_RSI = 5;
    bVar2 = readString((Reader *)(ulong)(uint)(int)CVar1);
    break;
  case (Reader *)0x2c:
    *in_RSI = 10;
    break;
  case (Reader *)0x2d:
  case (Reader *)0x30:
  case (Reader *)0x31:
  case (Reader *)0x32:
  case (Reader *)0x33:
  case (Reader *)0x34:
  case (Reader *)0x35:
  case (Reader *)0x36:
  case (Reader *)0x37:
  case (Reader *)0x38:
  case (Reader *)0x39:
    *in_RSI = 6;
    readNumber(in_RDI);
    break;
  case (Reader *)0x2f:
    *in_RSI = 0xc;
    bVar2 = readComment((Reader *)CONCAT17(CVar1,CONCAT16(1,in_stack_ffffffffffffffe8)));
    break;
  case (Reader *)0x3a:
    *in_RSI = 0xb;
    break;
  case (Reader *)0x5b:
    *in_RSI = 3;
    break;
  case (Reader *)0x5d:
    *in_RSI = 4;
    break;
  case (Reader *)0x66:
    *in_RSI = 8;
    bVar2 = match(in_RDI,"alse",4);
    break;
  case (Reader *)0x6e:
    *in_RSI = 9;
    bVar2 = match(in_RDI,"ull",3);
    break;
  case (Reader *)0x74:
    *in_RSI = 7;
    bVar2 = match(in_RDI,"rue",3);
    break;
  case (Reader *)0x7b:
    *in_RSI = 1;
    break;
  case (Reader *)0x7d:
    *in_RSI = 2;
  }
  if ((bVar2 & 1) == 0) {
    *in_RSI = 0xd;
  }
  *(Location *)(in_RSI + 4) = in_RDI->current_;
  return true;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}